

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regression.c
# Opt level: O1

void setIntercept(reg_object obj,int intercept)

{
  int iVar1;
  
  if (intercept == 0) {
    iVar1 = 0;
  }
  else if ((intercept != 1) || (iVar1 = 1, obj->p < 1)) {
    puts(
        "The variable intercept only accepts 0 or 1 values. Additionally, Intercept is 0 when p == 0. "
        );
    exit(-1);
  }
  obj->intercept = iVar1;
  return;
}

Assistant:

void setIntercept(reg_object obj, int intercept) {
	if (intercept == 1 && obj->p > 0) {
		obj->intercept = 1;
	}
	else if (intercept == 0) {
		obj->intercept = 0;
		//obj->p = obj->p - 1;
	}
	else {
		printf("The variable intercept only accepts 0 or 1 values. Additionally, Intercept is 0 when p == 0. \n");
		exit(-1);
	}
}